

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::FeatureDescription::InternalSwap
          (FeatureDescription *this,FeatureDescription *other)

{
  FeatureDescription *other_local;
  FeatureDescription *this_local;
  
  std::swap<std::__cxx11::string*>(&(this->name_).ptr_,&(other->name_).ptr_);
  std::swap<std::__cxx11::string*>(&(this->shortdescription_).ptr_,&(other->shortdescription_).ptr_)
  ;
  std::swap<CoreML::Specification::FeatureType*>(&this->type_,&other->type_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void FeatureDescription::InternalSwap(FeatureDescription* other) {
  name_.Swap(&other->name_);
  shortdescription_.Swap(&other->shortdescription_);
  std::swap(type_, other->type_);
  std::swap(_cached_size_, other->_cached_size_);
}